

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O3

int __thiscall DIS::Sensor::getMarshalledSize(Sensor *this)

{
  return 0xc;
}

Assistant:

int Sensor::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _sensorTypeSource
   marshalSize = marshalSize + 1;  // _sensorOnOffStatus
   marshalSize = marshalSize + 2;  // _sensorType
   marshalSize = marshalSize + 4;  // _station
   marshalSize = marshalSize + 2;  // _quantity
   marshalSize = marshalSize + 2;  // _padding
    return marshalSize;
}